

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O0

Boxed_Value
chaiscript::eval::detail::eval_function
          (Dispatch_Engine *t_ss,AST_NodePtr *t_node,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *t_param_names,
          vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *t_vals,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
          *t_locals)

{
  undefined8 uVar1;
  bool bVar2;
  size_type sVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined8 in_RSI;
  AST_Node *in_RDI;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *in_R8;
  long in_R9;
  Boxed_Value BVar4;
  Return_Value *rv;
  size_t i;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>
  *local;
  const_iterator __end3;
  const_iterator __begin3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
  *__range3;
  Stack_Push_Pop tpp;
  Boxed_Value *thisobj;
  Dispatch_State state;
  const_reference in_stack_fffffffffffffe98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  undefined7 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeaf;
  Dispatch_Engine *in_stack_fffffffffffffeb8;
  Dispatch_State *in_stack_fffffffffffffec0;
  Dispatch_State *in_stack_fffffffffffffed0;
  AST_Node *obj;
  string *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  reference local_e0;
  _Self local_d8;
  _Self local_d0;
  long local_c8;
  undefined1 local_99 [41];
  undefined8 local_70;
  undefined1 *local_68;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *local_60;
  Boxed_Value *local_58;
  undefined1 local_50 [32];
  long local_30;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *local_28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  undefined8 local_10;
  
  obj = in_RDI;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RSI;
  chaiscript::detail::Dispatch_State::Dispatch_State
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  local_70 = local_10;
  local_68 = local_50;
  local_60 = local_28;
  local_58 = eval_function::anon_class_24_3_184ec0ec::operator()
                       ((anon_class_24_3_184ec0ec *)
                        CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
  Stack_Push_Pop::Stack_Push_Pop
            ((Stack_Push_Pop *)in_stack_fffffffffffffea0,(Dispatch_State *)in_stack_fffffffffffffe98
            );
  if (local_58 != (Boxed_Value *)0x0) {
    in_stack_fffffffffffffed0 = (Dispatch_State *)local_99;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_99 + 1),"this",(allocator *)in_stack_fffffffffffffed0);
    Boxed_Value::Boxed_Value
              ((Boxed_Value *)in_stack_fffffffffffffea0,(Boxed_Value *)in_stack_fffffffffffffe98);
    chaiscript::detail::Dispatch_State::add_object
              ((Dispatch_State *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               in_stack_fffffffffffffee8,(Boxed_Value *)obj);
    Boxed_Value::~Boxed_Value((Boxed_Value *)0x34b242);
    std::__cxx11::string::~string((string *)(local_99 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_99);
  }
  if (local_30 != 0) {
    local_c8 = local_30;
    local_d0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
         ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
                  *)in_stack_fffffffffffffe98);
    local_d8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
                *)in_stack_fffffffffffffe98);
    while (bVar2 = std::operator!=(&local_d0,&local_d8), bVar2) {
      local_e0 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>
                 ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>
                              *)0x34b328);
      Boxed_Value::Boxed_Value
                ((Boxed_Value *)in_stack_fffffffffffffea0,(Boxed_Value *)in_stack_fffffffffffffe98);
      chaiscript::detail::Dispatch_State::add_object
                ((Dispatch_State *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                 in_stack_fffffffffffffee8,(Boxed_Value *)obj);
      Boxed_Value::~Boxed_Value((Boxed_Value *)0x34b373);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>
      ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>
                    *)in_stack_fffffffffffffea0);
    }
  }
  for (local_108.field_2._M_allocated_capacity = 0; uVar1 = local_108.field_2._M_allocated_capacity,
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(local_20), (ulong)uVar1 < sVar3;
      local_108.field_2._M_allocated_capacity = local_108.field_2._M_allocated_capacity + 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](local_20,local_108.field_2._M_allocated_capacity);
    bVar2 = std::operator!=(in_stack_fffffffffffffea0,(char *)in_stack_fffffffffffffe98);
    if (bVar2) {
      in_stack_fffffffffffffe98 =
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](local_20,local_108.field_2._M_allocated_capacity);
      std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::operator[]
                (local_28,local_108.field_2._M_allocated_capacity);
      in_stack_fffffffffffffea0 = &local_108;
      Boxed_Value::Boxed_Value
                ((Boxed_Value *)in_stack_fffffffffffffea0,(Boxed_Value *)in_stack_fffffffffffffe98);
      chaiscript::detail::Dispatch_State::add_object
                ((Dispatch_State *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                 in_stack_fffffffffffffee8,(Boxed_Value *)obj);
      Boxed_Value::~Boxed_Value((Boxed_Value *)0x34b46b);
    }
  }
  std::__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x34b4cb);
  AST_Node::eval(in_RDI,in_stack_fffffffffffffed0);
  Stack_Push_Pop::~Stack_Push_Pop((Stack_Push_Pop *)in_stack_fffffffffffffea0);
  BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)obj;
  return (Boxed_Value)
         BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Boxed_Value eval_function(chaiscript::detail::Dispatch_Engine &t_ss, const AST_NodePtr &t_node, const std::vector<std::string> &t_param_names, const std::vector<Boxed_Value> &t_vals, const std::map<std::string, Boxed_Value> *t_locals=nullptr) {
        chaiscript::detail::Dispatch_State state(t_ss);

        const Boxed_Value *thisobj = [&]() -> const Boxed_Value *{
          auto &stack = t_ss.get_stack_data(state.stack_holder()).back();
          if (!stack.empty() && stack.back().first == "__this") {
            return &stack.back().second;
          } else if (!t_vals.empty()) {
            return &t_vals[0];
          } else {
            return nullptr;
          }
        }();

        chaiscript::eval::detail::Stack_Push_Pop tpp(state);
        if (thisobj) state.add_object("this", *thisobj);

        if (t_locals) {
          for (const auto &local : *t_locals) {
            state.add_object(local.first, local.second);
          }
        }

        for (size_t i = 0; i < t_param_names.size(); ++i) {
          if (t_param_names[i] != "this") {
            state.add_object(t_param_names[i], t_vals[i]);
          }
        }

        try {
          return t_node->eval(state);
        } catch (detail::Return_Value &rv) {
          return std::move(rv.retval);
        } 
      }